

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (int *begin,long end,int param_3,uint param_4)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar10;
  int local_50;
  uint local_4c;
  
  local_4c = param_4;
  local_50 = param_3;
  do {
    while( true ) {
      uVar6 = end - (long)begin >> 2;
      if ((long)uVar6 < 0x18) {
        if ((local_4c & 1) == 0) {
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                    (begin,end);
          return;
        }
        insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin,end);
        return;
      }
      uVar7 = uVar6 >> 1;
      piVar9 = begin + uVar7;
      if (uVar6 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (piVar9,begin,end + -4);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin,piVar9,end + -4);
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin + 1,begin + (uVar7 - 1),end + -8);
        piVar8 = begin + uVar7 + 1;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin + 2,piVar8,end + -0xc);
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin + (uVar7 - 1),piVar9,piVar8);
        iVar1 = *begin;
        *begin = piVar8[-1];
        piVar8[-1] = iVar1;
      }
      if (((local_4c & 1) != 0) || (begin[-1] < *begin)) break;
      _Var4 = partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                        (begin,end);
      begin = _Var4._M_current + 1;
    }
    pVar10 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                       (begin,end);
    _Var4 = pVar10.first._M_current;
    uVar5 = (long)_Var4._M_current - (long)begin >> 2;
    piVar9 = _Var4._M_current + 1;
    uVar7 = end - (long)piVar9 >> 2;
    if (((long)uVar5 < (long)(uVar6 >> 3)) || ((long)uVar7 < (long)(uVar6 >> 3))) {
      local_50 = local_50 + -1;
      if (local_50 == 0) {
        std::
        make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin,end);
        std::
        sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin,end);
        return;
      }
      if (0x17 < (long)uVar5) {
        uVar6 = uVar5 & 0xfffffffffffffffc;
        iVar1 = *begin;
        *begin = *(int *)((long)begin + uVar6);
        *(int *)((long)begin + uVar6) = iVar1;
        iVar1 = _Var4._M_current[-1];
        _Var4._M_current[-1] = *(_Var4._M_current - uVar6);
        *(_Var4._M_current - uVar6) = iVar1;
        if (0x80 < uVar5) {
          uVar5 = uVar5 >> 2;
          iVar1 = begin[1];
          begin[1] = begin[uVar5 + 1];
          begin[uVar5 + 1] = iVar1;
          iVar1 = begin[2];
          begin[2] = begin[uVar5 + 2];
          begin[uVar5 + 2] = iVar1;
          iVar1 = _Var4._M_current[-2];
          _Var4._M_current[-2] = _Var4._M_current[~uVar5];
          _Var4._M_current[~uVar5] = iVar1;
          iVar1 = _Var4._M_current[-3];
          _Var4._M_current[-3] = _Var4._M_current[-2 - uVar5];
          _Var4._M_current[-2 - uVar5] = iVar1;
        }
      }
      if (0x17 < (long)uVar7) {
        uVar6 = uVar7 & 0xfffffffffffffffc;
        iVar1 = _Var4._M_current[1];
        _Var4._M_current[1] = *(_Var4._M_current + uVar6 + 4);
        *(_Var4._M_current + uVar6 + 4) = iVar1;
        uVar2 = *(undefined4 *)(end + -4);
        *(undefined4 *)(end + -4) = *(undefined4 *)(end - uVar6);
        *(undefined4 *)(end - uVar6) = uVar2;
        if (0x80 < uVar7) {
          uVar7 = uVar7 >> 2;
          iVar1 = _Var4._M_current[2];
          _Var4._M_current[2] = _Var4._M_current[uVar7 + 2];
          _Var4._M_current[uVar7 + 2] = iVar1;
          iVar1 = _Var4._M_current[3];
          _Var4._M_current[3] = _Var4._M_current[uVar7 + 3];
          _Var4._M_current[uVar7 + 3] = iVar1;
          uVar2 = *(undefined4 *)(end + -8);
          *(undefined4 *)(end + -8) = *(undefined4 *)(end + ~uVar7 * 4);
          *(undefined4 *)(end + ~uVar7 * 4) = uVar2;
          uVar2 = *(undefined4 *)(end + -0xc);
          *(undefined4 *)(end + -0xc) = *(undefined4 *)(end + (-2 - uVar7) * 4);
          *(undefined4 *)(end + (-2 - uVar7) * 4) = uVar2;
        }
      }
    }
    else if (((((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                (begin,_Var4._M_current), bVar3)) &&
            (bVar3 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                               (piVar9,end), bVar3)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
              (begin,_Var4._M_current,local_50,local_4c & 1);
    local_4c = 0;
    begin = piVar9;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }